

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_flac_get_length_in_pcm_frames(ma_flac *pFlac,ma_uint64 *pLength)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pFlac != (ma_flac *)0x0)) {
    *pLength = pFlac->dr->totalPCMFrameCount;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_flac_get_length_in_pcm_frames(ma_flac* pFlac, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_FLAC)
    {
        *pLength = pFlac->dr->totalPCMFrameCount;

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}